

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QGraphicsItem_*>::swapItemsAt(QList<QGraphicsItem_*> *this,qsizetype i,qsizetype j)

{
  QGraphicsItem **ppQVar1;
  long in_RSI;
  QArrayDataPointer<QGraphicsItem_*> *in_RDI;
  
  detach((QList<QGraphicsItem_*> *)0xa288b5);
  QArrayDataPointer<QGraphicsItem_*>::operator->(in_RDI);
  ppQVar1 = QArrayDataPointer<QGraphicsItem_*>::begin
                      ((QArrayDataPointer<QGraphicsItem_*> *)0xa288c6);
  ppQVar1 = ppQVar1 + in_RSI;
  QArrayDataPointer<QGraphicsItem_*>::operator->(in_RDI);
  QArrayDataPointer<QGraphicsItem_*>::begin((QArrayDataPointer<QGraphicsItem_*> *)0xa288e8);
  qSwap<QGraphicsItem*>(ppQVar1,(QGraphicsItem **)in_RDI);
  return;
}

Assistant:

void swapItemsAt(qsizetype i, qsizetype j) {
        Q_ASSERT_X(i >= 0 && i < size() && j >= 0 && j < size(),
                    "QList<T>::swap", "index out of range");
        detach();
        qSwap(d->begin()[i], d->begin()[j]);
    }